

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<Reference_MyClass>
          (Reference_MyClass t,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  element_type *ptr;
  shared_ptr<Reference_MyClass> p;
  undefined1 local_51;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> local_50;
  element_type *local_48;
  shared_ptr<Reference_MyClass> local_40;
  Any local_30;
  pointer_____offset_0x10___ *local_28;
  undefined4 local_20;
  
  std::make_shared<Reference_MyClass,Reference_MyClass>((Reference_MyClass *)&local_40);
  local_48 = local_40.super___shared_ptr<Reference_MyClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30.m_data._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl =
       (unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
        )&Reference_MyClass::typeinfo;
  local_28 = &Reference_MyClass::typeinfo;
  local_20 = 0;
  detail::Any::Any<std::shared_ptr<Reference_MyClass>,void>((Any *)&local_50,&local_40);
  local_51 = 0;
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,Reference_MyClass*&,bool&>
            (&in_RDI->m_type_info,&local_30,(bool *)&local_50,(Reference_MyClass **)&local_51,
             (bool *)&local_48);
  if (local_50._M_head_impl != (Data *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Data[1])();
  }
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<Reference_MyClass,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(T t, bool t_return_value) {
        auto p = std::make_shared<T>(std::move(t));
        auto ptr = p.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(p)), false, ptr, t_return_value);
      }